

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O0

void __thiscall NaDPlotFile::GetVarNameList(NaDPlotFile *this,int *nVars,char ***sVars)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  undefined4 *puVar5;
  char **ppcVar6;
  size_t sVar7;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  int iVar;
  int in_stack_ffffffffffffffcc;
  NaDynAr<char_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  iVar2 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 0x30));
  *in_RSI = iVar2;
  if (*in_RSI != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*in_RSI;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *in_RDX = (long)pvVar4;
    if (*in_RDX == 0) {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 4;
      __cxa_throw(puVar5,&NaException::typeinfo,0);
    }
    for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
      ppcVar6 = NaDynAr<char_*>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      sVar7 = strlen(*ppcVar6);
      pvVar4 = operator_new__(sVar7 + 1);
      *(void **)(*in_RDX + (long)local_1c * 8) = pvVar4;
      if (*(long *)(*in_RDX + (long)local_1c * 8) == 0) {
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 4;
        __cxa_throw(puVar5,&NaException::typeinfo,0);
      }
      in_stack_ffffffffffffffd0 = *(NaDynAr<char_*> **)(*in_RDX + (long)local_1c * 8);
      ppcVar6 = NaDynAr<char_*>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      strcpy((char *)in_stack_ffffffffffffffd0,*ppcVar6);
    }
  }
  return;
}

Assistant:

void    NaDPlotFile::GetVarNameList (int& nVars, char**& sVars)
{
    nVars = aVars.count();

    if(0 == nVars)
        return;

    sVars = new char*[nVars];
    if(NULL == sVars)
        throw(na_bad_alloc);

    int iVar;
    for(iVar = 0; iVar < nVars; ++iVar){
        sVars[iVar] = new char[1 + strlen(aVarNames[iVar])];
        if(NULL == sVars[iVar])
            throw(na_bad_alloc);
        strcpy(sVars[iVar], aVarNames[iVar]);
    }
}